

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O0

void move_gold(obj *gold,int vroom)

{
  char cVar1;
  char cVar2;
  int iVar3;
  xchar ny;
  xchar nx;
  int vroom_local;
  obj *gold_local;
  
  remove_object(gold);
  newsym((int)gold->ox,(int)gold->oy);
  cVar1 = level->rooms[vroom].lx;
  iVar3 = rn2(2);
  cVar1 = cVar1 + (char)iVar3;
  cVar2 = level->rooms[vroom].ly;
  iVar3 = rn2(2);
  cVar2 = cVar2 + (char)iVar3;
  place_object(gold,level,(int)cVar1,(int)cVar2);
  stackobj(gold);
  newsym((int)cVar1,(int)cVar2);
  return;
}

Assistant:

static void move_gold(struct obj *gold, int vroom)
{
	xchar nx, ny;

	remove_object(gold);
	newsym(gold->ox, gold->oy);
	nx = level->rooms[vroom].lx + rn2(2);
	ny = level->rooms[vroom].ly + rn2(2);
	place_object(gold, level, nx, ny);
	stackobj(gold);
	newsym(nx,ny);
}